

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnTable
          (BinaryReaderIR *this,Index index,Type elem_type,Limits *elem_limits)

{
  char *__s;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar1;
  uint64_t uVar2;
  Location loc;
  _Head_base<0UL,_wabt::TableModuleField_*,_false> local_60;
  TableModuleField *local_58;
  Location local_50;
  
  __s = this->filename_;
  aVar1.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_50.field_1.field_0.last_column = 0;
  local_50.filename.size_ = strlen(__s);
  local_50.filename.data_ = __s;
  local_50.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar1.offset;
  MakeUnique<wabt::TableModuleField,wabt::Location>((wabt *)&local_58,&local_50);
  *(undefined4 *)((long)&(local_58->table).elem_limits.max + 7) =
       *(undefined4 *)((long)&elem_limits->max + 7);
  uVar2 = elem_limits->max;
  (local_58->table).elem_limits.initial = elem_limits->initial;
  (local_58->table).elem_limits.max = uVar2;
  (local_58->table).elem_type.enum_ = elem_type.enum_;
  local_60._M_head_impl = local_58;
  local_58 = (TableModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                       *)&local_60);
  if (local_60._M_head_impl != (TableModuleField *)0x0) {
    (*((local_60._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_60._M_head_impl = (TableModuleField *)0x0;
  if (local_58 != (TableModuleField *)0x0) {
    (**(code **)(*(long *)local_58 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnTable(Index index,
                               Type elem_type,
                               const Limits* elem_limits) {
  auto field = MakeUnique<TableModuleField>(GetLocation());
  Table& table = field->table;
  table.elem_limits = *elem_limits;
  table.elem_type = elem_type;
  module_->AppendField(std::move(field));
  return Result::Ok;
}